

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnpy.cpp
# Opt level: O3

void cnpy::parse_zip_footer
               (FILE *fp,uint16_t *nrecs,size_t *global_header_size,size_t *global_header_offset)

{
  short sVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  short sVar4;
  undefined8 *__ptr;
  size_t sVar5;
  runtime_error *this;
  value_type *__val;
  
  __ptr = (undefined8 *)operator_new(0x16);
  *__ptr = 0;
  __ptr[1] = 0;
  *(undefined8 *)((long)__ptr + 0xe) = 0;
  fseek((FILE *)fp,-0x16,2);
  sVar5 = fread(__ptr,1,0x16,(FILE *)fp);
  if (sVar5 != 0x16) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"parse_zip_footer: failed fread");
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sVar1 = *(short *)((long)__ptr + 6);
  uVar2 = *(uint16_t *)(__ptr + 1);
  uVar3 = *(uint16_t *)((long)__ptr + 10);
  sVar4 = *(short *)((long)__ptr + 4);
  *nrecs = uVar3;
  *global_header_size = (ulong)*(uint *)((long)__ptr + 0xc);
  *global_header_offset = (ulong)*(uint *)(__ptr + 2);
  if (sVar4 != 0) {
    __assert_fail("disk_no == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vitobellini[P]cppsim/cnpy/cnpy.cpp"
                  ,0xac,"void cnpy::parse_zip_footer(FILE *, uint16_t &, size_t &, size_t &)");
  }
  if (sVar1 != 0) {
    __assert_fail("disk_start == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vitobellini[P]cppsim/cnpy/cnpy.cpp"
                  ,0xad,"void cnpy::parse_zip_footer(FILE *, uint16_t &, size_t &, size_t &)");
  }
  if (uVar2 == uVar3) {
    if (*(short *)((long)__ptr + 0x14) == 0) {
      operator_delete(__ptr);
      return;
    }
    __assert_fail("comment_len == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/vitobellini[P]cppsim/cnpy/cnpy.cpp"
                  ,0xaf,"void cnpy::parse_zip_footer(FILE *, uint16_t &, size_t &, size_t &)");
  }
  __assert_fail("nrecs_on_disk == nrecs",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vitobellini[P]cppsim/cnpy/cnpy.cpp"
                ,0xae,"void cnpy::parse_zip_footer(FILE *, uint16_t &, size_t &, size_t &)");
}

Assistant:

void cnpy::parse_zip_footer(FILE* fp, uint16_t& nrecs, size_t& global_header_size, size_t& global_header_offset)
{
    std::vector<char> footer(22);
    fseek(fp,-22,SEEK_END);
    size_t res = fread(&footer[0],sizeof(char),22,fp);
    if(res != 22)
        throw std::runtime_error("parse_zip_footer: failed fread");

    uint16_t disk_no, disk_start, nrecs_on_disk, comment_len;
    disk_no = *(uint16_t*) &footer[4];
    disk_start = *(uint16_t*) &footer[6];
    nrecs_on_disk = *(uint16_t*) &footer[8];
    nrecs = *(uint16_t*) &footer[10];
    global_header_size = *(uint32_t*) &footer[12];
    global_header_offset = *(uint32_t*) &footer[16];
    comment_len = *(uint16_t*) &footer[20];

    assert(disk_no == 0);
    assert(disk_start == 0);
    assert(nrecs_on_disk == nrecs);
    assert(comment_len == 0);
}